

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

int __thiscall
GF2::MP<4UL,_GF2::MOLex<4UL>_>::Compare
          (MP<4UL,_GF2::MOLex<4UL>_> *this,MP<4UL,_GF2::MOLex<4UL>_> *polyRight)

{
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var2 = (_List_node_base *)this;
  p_Var3 = (_List_node_base *)polyRight;
  while( true ) {
    p_Var2 = (((list<GF2::MM<4UL>,_std::allocator<GF2::MM<4UL>_>_> *)&p_Var2->_M_next)->
             super__List_base<GF2::MM<4UL>,_std::allocator<GF2::MM<4UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var3 = (((list<GF2::MM<4UL>,_std::allocator<GF2::MM<4UL>_>_> *)&p_Var3->_M_next)->
             super__List_base<GF2::MM<4UL>,_std::allocator<GF2::MM<4UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if ((p_Var2 == (_List_node_base *)this) || (p_Var3 == (_List_node_base *)polyRight)) break;
    if (*(ulong *)(p_Var2 + 1) != *(ulong *)(p_Var3 + 1)) {
      return (*(ulong *)(p_Var3 + 1) < *(ulong *)(p_Var2 + 1)) - 1 | 1;
    }
  }
  iVar1 = 1;
  if (p_Var2 == (_List_node_base *)this) {
    iVar1 = -(uint)(p_Var3 != (_List_node_base *)polyRight);
  }
  return iVar1;
}

Assistant:

int Compare(const MP& polyRight) const
	{
		assert(IsConsistent(polyRight));
		// цикл по мономам
		const_iterator iter = begin(), iterRight = polyRight.begin();
		for (; iter != end() && iterRight != polyRight.end(); ++iter, ++iterRight)
			if (int cmp = _order.Compare(*iter, *iterRight))
				return cmp;
		// проверка хвостов
		if (iter == end()) 
			return iterRight == polyRight.end() ? 0 : -1;
        return 1;
	}